

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

Privkey * cfd::core::AdaptorUtil::ExtractSecret
                    (Privkey *__return_storage_ptr__,AdaptorSignature *adaptor_sig,
                    ByteData *signature,Pubkey *adaptor)

{
  int iVar1;
  CfdException *this;
  uchar *adaptor_sig65;
  undefined8 uVar2;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  size_type in_stack_fffffffffffffe88;
  secp256k1_context *ctx_00;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe90;
  ByteData local_150;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  ByteData local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  int local_e0;
  undefined1 local_dc [4];
  int ret;
  secp256k1_pubkey_conflict secp_adaptor;
  secp256k1_ecdsa_signature secp_sig;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> secret;
  secp256k1_context_struct *ctx;
  Pubkey *adaptor_local;
  ByteData *signature_local;
  AdaptorSignature *adaptor_sig_local;
  
  secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wally_get_secp_context();
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x70b745);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x70b765);
  ParseSignature((secp256k1_ecdsa_signature *)(secp_adaptor.data + 0x38),signature);
  ParsePubkey((secp256k1_pubkey_conflict *)local_dc,adaptor);
  ctx_00 = (secp256k1_context *)
           secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x70b79d);
  AdaptorSignature::GetData(&local_110,adaptor_sig);
  ByteData::GetBytes(&local_f8,&local_110);
  adaptor_sig65 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x70b7d7);
  iVar1 = secp256k1_ecdsa_adaptor_extract_secret
                    (ctx_00,(uchar *)this,(secp256k1_ecdsa_signature *)(secp_adaptor.data + 0x38),
                     adaptor_sig65,(secp256k1_pubkey_conflict *)local_dc);
  error_code = (CfdError)((ulong)ctx_00 >> 0x20);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffe80));
  ByteData::~ByteData((ByteData *)0x70b81b);
  local_e0 = iVar1;
  if (iVar1 != 1) {
    local_132 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_130,"Could not extract secret.",&local_131);
    CfdException::CfdException(this,error_code,(string *)CONCAT44(iVar1,in_stack_fffffffffffffe80));
    local_132 = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_150,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  Privkey::Privkey(__return_storage_ptr__,&local_150,kMainnet,true);
  ByteData::~ByteData((ByteData *)0x70b9a2);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffe80));
  return __return_storage_ptr__;
}

Assistant:

Privkey AdaptorUtil::ExtractSecret(
    const AdaptorSignature &adaptor_sig, const ByteData &signature,
    const Pubkey &adaptor) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> secret(Privkey::kPrivkeySize);
  auto secp_sig = ParseSignature(signature);
  auto secp_adaptor = ParsePubkey(adaptor);
  auto ret = secp256k1_ecdsa_adaptor_extract_secret(
      ctx, secret.data(), &secp_sig, adaptor_sig.GetData().GetBytes().data(),
      &secp_adaptor);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not extract secret.");
  }

  return Privkey(ByteData(secret));
}